

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTransactionManager::PushCatalogEntry
          (DuckTransactionManager *this,Transaction *transaction_p,CatalogEntry *entry,
          data_ptr_t extra_data,idx_t extra_data_size)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  bool bVar3;
  InternalException *this_00;
  string local_50;
  
  bVar3 = AttachedDatabase::IsSystem((this->super_TransactionManager).db);
  if (!bVar3) {
    bVar3 = AttachedDatabase::IsTemporary((this->super_TransactionManager).db);
    if ((!bVar3) && (transaction_p->is_read_only == true)) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Attempting to do catalog changes on a transaction that is read-only - this should not be possible"
                 ,"");
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  LOCK();
  paVar1 = &this->last_uncommitted_catalog_version;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  transaction_p[1].active_query.super___atomic_base<unsigned_long>._M_i = _Var2 + 1;
  UNLOCK();
  DuckTransaction::PushCatalogEntry
            ((DuckTransaction *)transaction_p,entry,extra_data,extra_data_size);
  return;
}

Assistant:

void DuckTransactionManager::PushCatalogEntry(Transaction &transaction_p, duckdb::CatalogEntry &entry,
                                              duckdb::data_ptr_t extra_data, duckdb::idx_t extra_data_size) {
	auto &transaction = transaction_p.Cast<DuckTransaction>();
	if (!db.IsSystem() && !db.IsTemporary() && transaction.IsReadOnly()) {
		throw InternalException("Attempting to do catalog changes on a transaction that is read-only - "
		                        "this should not be possible");
	}
	transaction.catalog_version = ++last_uncommitted_catalog_version;
	transaction.PushCatalogEntry(entry, extra_data, extra_data_size);
}